

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O2

RowVector __thiscall
rek::Solver::solve(Solver *this,Matrix<double,__1,__1,_0,__1,__1> *AColMajor,
                  Matrix<double,__1,__1,_1,__1,__1> *ARowMajor,RowVector *b,long maxIterations,
                  double tolerance)

{
  Scalar *pSVar1;
  CoeffReturnType pdVar2;
  long i;
  Index extraout_RDX;
  long lVar3;
  long lVar4;
  long in_R9;
  bool bVar5;
  RowVector RVar6;
  double val;
  RowVector z;
  RowVector columnNorms;
  RowVector rowNorms;
  double local_150;
  Scalar local_148;
  DenseStorage<double,__1,__1,_1,_0> local_130;
  Index local_120;
  Index local_118;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_110;
  Matrix<double,__1,__1,_0,__1,__1> *local_108;
  Matrix<double,__1,_1,_0,__1,_1> local_100;
  Matrix<double,__1,_1,_0,__1,_1> local_f0;
  double local_e0;
  double local_d8;
  ReturnType local_d0;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_90;
  
  local_118 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_120 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols;
  local_108 = AColMajor;
  local_e0 = tolerance;
  local_90._0_8_ = local_120;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long *)&local_90);
  local_110 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)maxIterations;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_130,(DenseStorage<double,__1,__1,_1,_0> *)maxIterations);
  local_90._0_8_ =
       (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
       m_rows;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_f0,(long *)&local_90);
  local_90._0_8_ =
       (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
       m_cols;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_100,(long *)&local_90);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < local_118) {
    lVar4 = local_118;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_90,
               (Matrix<double,__1,__1,_1,__1,__1> *)b,lVar3);
    local_148 = Eigen::
                MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
                squaredNorm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                             *)&local_90);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_f0,
                        lVar3);
    *pSVar1 = local_148;
  }
  lVar3 = 0;
  lVar4 = 0;
  if (0 < local_120) {
    lVar4 = local_120;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_90,
               (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,lVar3);
    local_148 = Eigen::
                MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
                squaredNorm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                             *)&local_90);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_100,
                        lVar3);
    *pSVar1 = local_148;
  }
  if (in_R9 < 1) {
    in_R9 = 0;
  }
  lVar4 = 0;
  while (bVar5 = in_R9 != 0, in_R9 = in_R9 + -1, bVar5) {
    if ((lVar4 + 1) %
        (long)*(int *)&(local_108->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                       .m_storage.m_data == 0) {
      bVar5 = hasConvergedDense((Solver *)local_108,(Matrix<double,__1,__1,_1,__1,__1> *)b,
                                (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,(RowVector *)this,
                                (RowVector *)local_110,(RowVector *)&local_130,local_e0);
      if (bVar5) break;
    }
    lVar3 = lVar4 % local_118;
    i = lVar4 % local_120;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_90,
               (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,i);
    local_148 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_130,
                           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                            *)&local_90);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_100,i);
    local_150 = -local_148 / *pSVar1;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              (&local_c8,(Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,i);
    Eigen::operator*(&local_90,&local_150,(StorageBaseType *)&local_c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_130,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_90);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_90,
               (Matrix<double,__1,__1,_1,__1,__1> *)b,lVar3);
    local_150 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                            *)&local_90);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (local_110,lVar3);
    local_148 = *pdVar2;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_130,
                        lVar3);
    local_d8 = *pSVar1;
    local_d0 = local_150;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_f0,
                        lVar3);
    local_150 = ((local_148 - local_d8) - local_d0) / *pSVar1;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_c8,
               (Matrix<double,__1,__1,_1,__1,__1> *)b,lVar3);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                      *)&local_90,&local_150,(StorageBaseType *)&local_c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                *)&local_90);
    lVar4 = lVar4 + 1;
  }
  free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_130.m_data);
  RVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  RVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (RowVector)RVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

RowVector solve(Matrix<double, Dynamic, Dynamic, ColMajor> &AColMajor,
                  Matrix<double, Dynamic, Dynamic, RowMajor> &ARowMajor,
                  const RowVector &b, long maxIterations,
                  double tolerance = tolerance_) const {
    const long m = ARowMajor.rows(), n = AColMajor.cols();
    RowVector x(AColMajor.cols());
    RowVector z(b);
    RowVector rowNorms(AColMajor.rows());
    RowVector columnNorms(AColMajor.cols());

    x.setZero();

    for (long i = 0; i < m; i++) {
      rowNorms(i) = ARowMajor.row(i).squaredNorm();
    }

    for (long j = 0; j < n; j++) {
      columnNorms(j) = AColMajor.col(j).squaredNorm();
    }

    for (long k = 0; k < maxIterations; k++) {
      // Check for convergence every blockSize_ iterations
      if ((k + 1) % blockSize_ == 0 &&
          hasConvergedDense(ARowMajor, AColMajor, x, b, z, tolerance)) {
        break;
      }

      // Extended Kaczmarz
      const long i_k = k % m;
      const long j_k = k % n;

      double val = -z.dot(AColMajor.col(j_k)) / columnNorms(j_k);
      z += val * AColMajor.col(j_k);
      val = x.dot(ARowMajor.row(i_k));
      val = (b(i_k) - z(i_k) - val) / rowNorms(i_k);

      x += val * ARowMajor.row(i_k);
    }
    return x;
  }